

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

TraceFormat cmake::StringToTraceFormat(string *traceStr)

{
  pointer ppVar1;
  bool bVar2;
  int iVar3;
  TraceFormat TVar4;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_>_>_>
  __it;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_>_>_>
  __it_00;
  long lVar5;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_>_>_>
  _Var6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_>
  __l;
  string traceStrLowCase;
  allocator_type local_91;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>
  *local_90;
  TraceFormat local_84;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>
  local_80;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>
  local_58;
  
  if ((StringToTraceFormat(std::__cxx11::string_const&)::levels_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&StringToTraceFormat(std::__cxx11::string_const&)::
                                   levels_abi_cxx11_), iVar3 != 0)) {
    local_90 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>
                *)CONCAT44(local_90._4_4_,1);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>
    ::pair<const_char_(&)[6],_cmake::TraceFormat,_true>
              (&local_80,(char (*) [6])"human",(TraceFormat *)&local_90);
    local_84 = TRACE_JSON_V1;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>
    ::pair<const_char_(&)[8],_cmake::TraceFormat,_true>(&local_58,(char (*) [8])"json-v1",&local_84)
    ;
    __l._M_len = 2;
    __l._M_array = &local_80;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_>_>
    ::vector(&StringToTraceFormat(std::__cxx11::string_const&)::levels_abi_cxx11_,__l,&local_91);
    lVar5 = -0x50;
    paVar7 = &local_58.first.field_2;
    do {
      if (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar7->_M_allocated_capacity)[-2]) {
        operator_delete((long *)(&paVar7->_M_allocated_capacity)[-2],
                        paVar7->_M_allocated_capacity + 1);
      }
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(&paVar7->_M_allocated_capacity + -5);
      lVar5 = lVar5 + 0x28;
    } while (lVar5 != 0);
    __cxa_atexit(std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_>_>
                 ::~vector,&StringToTraceFormat(std::__cxx11::string_const&)::levels_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&StringToTraceFormat(std::__cxx11::string_const&)::levels_abi_cxx11_);
  }
  cmsys::SystemTools::LowerCase(&local_80.first,traceStr);
  ppVar1 = StringToTraceFormat(std::__cxx11::string_const&)::levels_abi_cxx11_.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = ((long)StringToTraceFormat(std::__cxx11::string_const&)::levels_abi_cxx11_.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)StringToTraceFormat(std::__cxx11::string_const&)::levels_abi_cxx11_.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333 >> 2;
  __it_00._M_current =
       StringToTraceFormat(std::__cxx11::string_const&)::levels_abi_cxx11_.
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_90 = &local_80;
  if (0 < lVar5) {
    __it_00._M_current =
         StringToTraceFormat(std::__cxx11::string_const&)::levels_abi_cxx11_.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_>_>
         ._M_impl.super__Vector_impl_data._M_start + lVar5 * 4;
    lVar5 = lVar5 + 1;
    __it._M_current =
         StringToTraceFormat(std::__cxx11::string_const&)::levels_abi_cxx11_.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    do {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<cmake::StringToTraceFormat(std::__cxx11::string_const&)::$_0>::operator()
                        ((_Iter_pred<cmake::StringToTraceFormat(std::__cxx11::string_const&)::__0> *
                         )&local_90,__it);
      _Var6._M_current = __it._M_current;
      if (bVar2) goto LAB_002a10db;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<cmake::StringToTraceFormat(std::__cxx11::string_const&)::$_0>::operator()
                        ((_Iter_pred<cmake::StringToTraceFormat(std::__cxx11::string_const&)::__0> *
                         )&local_90,__it._M_current + 1);
      _Var6._M_current = __it._M_current + 1;
      if (bVar2) goto LAB_002a10db;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<cmake::StringToTraceFormat(std::__cxx11::string_const&)::$_0>::operator()
                        ((_Iter_pred<cmake::StringToTraceFormat(std::__cxx11::string_const&)::__0> *
                         )&local_90,__it._M_current + 2);
      _Var6._M_current = __it._M_current + 2;
      if (bVar2) goto LAB_002a10db;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<cmake::StringToTraceFormat(std::__cxx11::string_const&)::$_0>::operator()
                        ((_Iter_pred<cmake::StringToTraceFormat(std::__cxx11::string_const&)::__0> *
                         )&local_90,__it._M_current + 3);
      _Var6._M_current = __it._M_current + 3;
      if (bVar2) goto LAB_002a10db;
      __it._M_current = __it._M_current + 4;
      lVar5 = lVar5 + -1;
    } while (1 < lVar5);
  }
  lVar5 = ((long)ppVar1 - (long)__it_00._M_current >> 3) * -0x3333333333333333;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      _Var6._M_current = ppVar1;
      if ((lVar5 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<cmake::StringToTraceFormat(std::__cxx11::string_const&)::$_0>::
                  operator()((_Iter_pred<cmake::StringToTraceFormat(std::__cxx11::string_const&)::__0>
                              *)&local_90,__it_00), _Var6._M_current = __it_00._M_current, bVar2))
      goto LAB_002a10db;
      __it_00._M_current = __it_00._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<cmake::StringToTraceFormat(std::__cxx11::string_const&)::$_0>::operator()
                      ((_Iter_pred<cmake::StringToTraceFormat(std::__cxx11::string_const&)::__0> *)
                       &local_90,__it_00);
    _Var6._M_current = __it_00._M_current;
    if (bVar2) goto LAB_002a10db;
    __it_00._M_current = __it_00._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::_Iter_pred<cmake::StringToTraceFormat(std::__cxx11::string_const&)::$_0>
          ::operator()((_Iter_pred<cmake::StringToTraceFormat(std::__cxx11::string_const&)::__0> *)
                       &local_90,__it_00);
  _Var6._M_current = __it_00._M_current;
  if (!bVar2) {
    _Var6._M_current = ppVar1;
  }
LAB_002a10db:
  if (_Var6._M_current == ppVar1) {
    TVar4 = TRACE_UNDEFINED;
  }
  else {
    TVar4 = (_Var6._M_current)->second;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.first._M_dataplus._M_p != &local_80.first.field_2) {
    operator_delete(local_80.first._M_dataplus._M_p,local_80.first.field_2._M_allocated_capacity + 1
                   );
  }
  return TVar4;
}

Assistant:

cmake::TraceFormat cmake::StringToTraceFormat(const std::string& traceStr)
{
  using TracePair = std::pair<std::string, TraceFormat>;
  static const std::vector<TracePair> levels = {
    { "human", TraceFormat::TRACE_HUMAN },
    { "json-v1", TraceFormat::TRACE_JSON_V1 },
  };

  const auto traceStrLowCase = cmSystemTools::LowerCase(traceStr);

  const auto it = std::find_if(levels.cbegin(), levels.cend(),
                               [&traceStrLowCase](const TracePair& p) {
                                 return p.first == traceStrLowCase;
                               });
  return (it != levels.cend()) ? it->second : TraceFormat::TRACE_UNDEFINED;
}